

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::clear(raw_quasi_adaptive_huffman_data_model *this)

{
  vector<unsigned_short>::clear(&this->m_sym_freq);
  vector<unsigned_short>::clear(&this->m_codes);
  vector<unsigned_char>::clear(&this->m_code_sizes);
  this->m_total_syms = 0;
  this->m_max_cycle = 0;
  this->m_update_cycle = 0;
  this->m_symbols_until_update = 0;
  *(undefined8 *)((long)&this->m_symbols_until_update + 1) = 0;
  if (this->m_pDecode_tables != (decoder_tables *)0x0) {
    lzham_delete<lzham::prefix_coding::decoder_tables>(this->m_pDecode_tables);
    this->m_pDecode_tables = (decoder_tables *)0x0;
  }
  this->m_fast_updating = false;
  this->m_use_polar_codes = false;
  return;
}

Assistant:

void raw_quasi_adaptive_huffman_data_model::clear()
   {
      m_sym_freq.clear();
      m_codes.clear();
      m_code_sizes.clear();

      m_max_cycle = 0;
      m_total_syms = 0;
      m_update_cycle = 0;
      m_symbols_until_update = 0;
      m_decoder_table_bits = 0;
      m_total_count = 0;

      if (m_pDecode_tables)
      {
         lzham_delete(m_pDecode_tables);
         m_pDecode_tables = NULL;
      }

      m_fast_updating = false;
      m_use_polar_codes = false;
   }